

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O1

bool __thiscall cmCacheManager::SaveCache(cmCacheManager *this,string *path,cmMessenger *messenger)

{
  CacheEntryMap *this_00;
  _Base_ptr *key;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  CacheEntryType type;
  int iVar2;
  pointer pcVar3;
  char cVar4;
  char cVar5;
  uint uVar6;
  ostream *poVar7;
  string *psVar8;
  char *pcVar9;
  size_t sVar10;
  cmCacheManager *pcVar11;
  cmCacheManager *pcVar12;
  uint uVar13;
  iterator iVar14;
  bool bVar15;
  CacheIterator i;
  string currentcwd;
  string checkCacheFile;
  string cacheFile;
  ofstream checkCache;
  cmGeneratedFileStream fout;
  string local_518;
  cmCacheManager *local_4f8;
  string local_4f0;
  cmMessenger *local_4d0;
  cmCacheManager *local_4c8;
  string local_4c0;
  string *local_4a0;
  undefined1 local_498 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_488;
  byte abStack_478 [216];
  ios_base local_3a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  undefined1 local_278 [584];
  
  local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
  pcVar3 = (path->_M_dataplus)._M_p;
  local_4f8 = this;
  local_4d0 = messenger;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4c0,pcVar3,pcVar3 + path->_M_string_length);
  std::__cxx11::string::append((char *)&local_4c0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,&local_4c0,false,None);
  cmGeneratedFileStream::SetCopyIfDifferent((cmGeneratedFileStream *)local_278,true);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) == 0) {
    local_498._0_8_ = &local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_CACHE_MAJOR_VERSION","");
    uVar6 = cmVersion::GetMajorVersion();
    cVar5 = '\x01';
    if (9 < uVar6) {
      uVar13 = uVar6;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar13 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0034a626;
        }
        if (uVar13 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0034a626;
        }
        if (uVar13 < 10000) goto LAB_0034a626;
        bVar15 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar15);
      cVar5 = cVar5 + '\x01';
    }
LAB_0034a626:
    paVar1 = &local_518.field_2;
    local_518._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_518,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_518._M_dataplus._M_p,(uint)local_518._M_string_length,uVar6);
    AddCacheEntry(local_4f8,(string *)local_498,local_518._M_dataplus._M_p,
                  "Major version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != paVar1) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
    }
    local_498._0_8_ = &local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_CACHE_MINOR_VERSION","");
    uVar6 = cmVersion::GetMinorVersion();
    cVar5 = '\x01';
    if (9 < uVar6) {
      uVar13 = uVar6;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar13 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0034a723;
        }
        if (uVar13 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0034a723;
        }
        if (uVar13 < 10000) goto LAB_0034a723;
        bVar15 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar15);
      cVar5 = cVar5 + '\x01';
    }
LAB_0034a723:
    local_518._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_518,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_518._M_dataplus._M_p,(uint)local_518._M_string_length,uVar6);
    AddCacheEntry(local_4f8,(string *)local_498,local_518._M_dataplus._M_p,
                  "Minor version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != paVar1) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
    }
    local_498._0_8_ = &local_488;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_498,"CMAKE_CACHE_PATCH_VERSION","");
    uVar6 = cmVersion::GetPatchVersion();
    cVar5 = '\x01';
    if (9 < uVar6) {
      uVar13 = uVar6;
      cVar4 = '\x04';
      do {
        cVar5 = cVar4;
        if (uVar13 < 100) {
          cVar5 = cVar5 + -2;
          goto LAB_0034a81a;
        }
        if (uVar13 < 1000) {
          cVar5 = cVar5 + -1;
          goto LAB_0034a81a;
        }
        if (uVar13 < 10000) goto LAB_0034a81a;
        bVar15 = 99999 < uVar13;
        uVar13 = uVar13 / 10000;
        cVar4 = cVar5 + '\x04';
      } while (bVar15);
      cVar5 = cVar5 + '\x01';
    }
LAB_0034a81a:
    local_518._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_518,cVar5);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_518._M_dataplus._M_p,(uint)local_518._M_string_length,uVar6);
    AddCacheEntry(local_4f8,(string *)local_498,local_518._M_dataplus._M_p,
                  "Patch version of cmake used to create the current loaded cache",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != paVar1) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
    }
    pcVar3 = (path->_M_dataplus)._M_p;
    local_518._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_518,pcVar3,pcVar3 + path->_M_string_length);
    local_4a0 = path;
    if (((byte)(*local_518._M_dataplus._M_p + 0xbfU) < 0x1a) &&
       (local_518._M_dataplus._M_p[1] == 0x3a)) {
      *local_518._M_dataplus._M_p = *local_518._M_dataplus._M_p | 0x20;
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_518);
    local_498._0_8_ = &local_488;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"CMAKE_CACHEFILE_DIR","");
    AddCacheEntry(local_4f8,(string *)local_498,local_518._M_dataplus._M_p,
                  "This is the directory where this CMakeCache.txt was created",INTERNAL);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# This is the CMakeCache file.\n",0x1f);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# For build in directory: ",0x1a);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_278,local_518._M_dataplus._M_p,
                        CONCAT44(local_518._M_string_length._4_4_,(uint)local_518._M_string_length))
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"# It was generated by CMake: ",0x1d);
    psVar8 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,(psVar8->_M_dataplus)._M_p,psVar8->_M_string_length);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,
               "# You can edit this file to change values found and used by cmake.",0x42);
    std::ios::widen((char)(ostream *)local_278 + (char)*(_func_int **)(local_278._0_8_ + -0x18));
    std::ostream::put((char)local_278);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"# If you do not want to change any of the values, simply exit the editor.",
               0x49);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"# If you do want to change a value, simply edit, save, and exit the editor.",
               0x4b);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"# The syntax for the file is as follows:\n",0x29);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"# KEY:TYPE=VALUE\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"# KEY is the name of a variable in the cache.\n",0x2e);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT TYPE!.",0x42);
    std::ios::widen((char)poVar7->_vptr_basic_ostream[-3] + (char)poVar7);
    std::ostream::put((char)poVar7);
    poVar7 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,"# VALUE is the current value for the KEY.\n\n",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"########################\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# EXTERNAL cache entries\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"########################\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
    pcVar11 = (cmCacheManager *)
              (local_4f8->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    local_4c8 = (cmCacheManager *)&(local_4f8->Cache)._M_t._M_impl.super__Rb_tree_header;
    if (pcVar11 != local_4c8) {
      do {
        type = *(CacheEntryType *)
                &pcVar11[1].Cache._M_t._M_impl.super__Rb_tree_header._M_header._M_right;
        if ((type != INTERNAL &
            (byte)pcVar11[2].Cache._M_t._M_impl.super__Rb_tree_header._M_node_count) == 1) {
          local_498._0_8_ = &local_488;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"HELPSTRING","");
          this_00 = &pcVar11[1].Cache;
          pcVar9 = CacheEntry::GetProperty((CacheEntry *)this_00,(string *)local_498);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._0_8_ != &local_488) {
            operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
          }
          local_498._0_8_ = &local_488;
          if (pcVar9 == (char *)0x0) {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_498,"Missing description","");
            OutputHelpString((ostream *)local_278,(string *)local_498);
          }
          else {
            sVar10 = strlen(pcVar9);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_498,pcVar9,pcVar9 + sVar10);
            OutputHelpString((ostream *)local_278,(string *)local_498);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._0_8_ != &local_488) {
            operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
          }
          key = &(pcVar11->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          OutputKey((ostream *)local_278,(string *)key);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,":",1);
          pcVar9 = cmState::CacheEntryTypeToString(type);
          if (pcVar9 == (char *)0x0) {
            std::ios::clear((int)&local_518 + (int)*(_func_int **)(local_278._0_8_ + -0x18) + 0x2a0)
            ;
          }
          else {
            sVar10 = strlen(pcVar9);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar9,sVar10);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"=",1);
          OutputValue((ostream *)local_278,(string *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
          OutputNewlineTruncationWarning
                    ((ostream *)local_278,(string *)key,(string *)this_00,local_4d0);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
        }
        pcVar11 = (cmCacheManager *)std::_Rb_tree_increment((_Rb_tree_node_base *)pcVar11);
      } while (pcVar11 != local_4c8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"########################\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"# INTERNAL cache entries\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_278,"########################\n",0x19);
    pcVar11 = (cmCacheManager *)local_278;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)pcVar11,"\n",1);
    iVar14._M_node = (local_4f8->Cache)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((cmCacheManager *)iVar14._M_node != local_4c8) {
      do {
        if ((char)iVar14._M_node[5]._M_color == _S_black) {
          iVar2 = iVar14._M_node[3]._M_color;
          i.Position._M_node = iVar14._M_node;
          i.Container = local_4f8;
          WritePropertyEntries(pcVar11,(ostream *)local_278,i,local_4d0);
          if (iVar2 == 4) {
            local_498._0_8_ = &local_488;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"HELPSTRING","");
            pcVar9 = CacheEntry::GetProperty((CacheEntry *)(iVar14._M_node + 2),(string *)local_498)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ != &local_488) {
              operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
            }
            if (pcVar9 != (char *)0x0) {
              local_498._0_8_ = &local_488;
              sVar10 = strlen(pcVar9);
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_498,pcVar9,pcVar9 + sVar10);
              OutputHelpString((ostream *)local_278,(string *)local_498);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_498._0_8_ != &local_488) {
                operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
              }
            }
            local_498._0_8_ = &local_488;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_498,*(_Base_ptr *)(iVar14._M_node + 1),
                       (long)&(*(_Base_ptr *)(iVar14._M_node + 1))->_M_color +
                       (long)&(iVar14._M_node[1]._M_parent)->_M_color);
            OutputKey((ostream *)local_278,(string *)local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ != &local_488) {
              operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,":",1);
            pcVar9 = cmState::CacheEntryTypeToString(INTERNAL);
            if (pcVar9 == (char *)0x0) {
              std::ios::clear((int)&local_518 + (int)*(_func_int **)(local_278._0_8_ + -0x18) +
                              0x2a0);
            }
            else {
              sVar10 = strlen(pcVar9);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,pcVar9,sVar10)
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"=",1);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_498,*(char **)(iVar14._M_node + 2),
                       (allocator<char> *)&local_4f0);
            OutputValue((ostream *)local_278,(string *)local_498);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ != &local_488) {
              operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
            local_498._0_8_ = &local_488;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_498,*(_Base_ptr *)(iVar14._M_node + 1),
                       (long)&(*(_Base_ptr *)(iVar14._M_node + 1))->_M_color +
                       (long)&(iVar14._M_node[1]._M_parent)->_M_color);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_4f0,*(char **)(iVar14._M_node + 2),
                       (allocator<char> *)&local_298);
            OutputNewlineTruncationWarning
                      ((ostream *)local_278,(string *)local_498,&local_4f0,local_4d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
              operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_498._0_8_ != &local_488) {
              operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
            }
          }
        }
        pcVar12 = (cmCacheManager *)std::_Rb_tree_increment(iVar14._M_node);
        pcVar11 = (cmCacheManager *)iVar14._M_node;
        iVar14._M_node = (_Base_ptr)pcVar12;
      } while (pcVar12 != local_4c8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_278,"\n",1);
    cmGeneratedFileStream::Close((cmGeneratedFileStream *)local_278);
    pcVar3 = (local_4a0->_M_dataplus)._M_p;
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4f0,pcVar3,pcVar3 + local_4a0->_M_string_length);
    std::__cxx11::string::append((char *)&local_4f0);
    cmsys::SystemTools::MakeDirectory(&local_4f0,(mode_t *)0x0);
    std::__cxx11::string::append((char *)&local_4f0);
    std::ofstream::ofstream(local_498,local_4f0._M_dataplus._M_p,_S_out);
    bVar15 = (abStack_478[*(long *)(local_498._0_8_ + -0x18)] & 5) == 0;
    if (bVar15) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_498,
                 "# This file is generated by cmake for dependency checking of the CMakeCache.txt file\n"
                 ,0x55);
    }
    else {
      std::operator+(&local_298,"Unable to open check cache file for write. ",&local_4f0);
      cmSystemTools::Error(&local_298);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
    }
    local_498._0_8_ = _VTT;
    *(undefined8 *)(local_498 + *(long *)(_VTT->_M_local_buf + -0x18)) = _vtable;
    std::filebuf::~filebuf((filebuf *)(local_498 + 8));
    std::ios_base::~ios_base(local_3a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_518._M_dataplus._M_p != &local_518.field_2) {
      operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_498,
                   "Unable to open cache file for save. ",&local_4c0);
    cmSystemTools::Error((string *)local_498);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._0_8_ != &local_488) {
      operator_delete((void *)local_498._0_8_,local_488._M_allocated_capacity + 1);
    }
    cmSystemTools::ReportLastSystemError("");
    bVar15 = false;
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  return bVar15;
}

Assistant:

bool cmCacheManager::SaveCache(const std::string& path, cmMessenger* messenger)
{
  std::string cacheFile = path;
  cacheFile += "/CMakeCache.txt";
  cmGeneratedFileStream fout(cacheFile);
  fout.SetCopyIfDifferent(true);
  if (!fout) {
    cmSystemTools::Error("Unable to open cache file for save. " + cacheFile);
    cmSystemTools::ReportLastSystemError("");
    return false;
  }
  // before writing the cache, update the version numbers
  // to the
  this->AddCacheEntry("CMAKE_CACHE_MAJOR_VERSION",
                      std::to_string(cmVersion::GetMajorVersion()).c_str(),
                      "Major version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_MINOR_VERSION",
                      std::to_string(cmVersion::GetMinorVersion()).c_str(),
                      "Minor version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);
  this->AddCacheEntry("CMAKE_CACHE_PATCH_VERSION",
                      std::to_string(cmVersion::GetPatchVersion()).c_str(),
                      "Patch version of cmake used to create the "
                      "current loaded cache",
                      cmStateEnums::INTERNAL);

  // Let us store the current working directory so that if somebody
  // Copies it, he will not be surprised
  std::string currentcwd = path;
  if (currentcwd[0] >= 'A' && currentcwd[0] <= 'Z' && currentcwd[1] == ':') {
    // Cast added to avoid compiler warning. Cast is ok because
    // value is guaranteed to fit in char by the above if...
    currentcwd[0] = static_cast<char>(currentcwd[0] - 'A' + 'a');
  }
  cmSystemTools::ConvertToUnixSlashes(currentcwd);
  this->AddCacheEntry("CMAKE_CACHEFILE_DIR", currentcwd.c_str(),
                      "This is the directory where this CMakeCache.txt"
                      " was created",
                      cmStateEnums::INTERNAL);

  /* clang-format off */
  fout << "# This is the CMakeCache file.\n"
       << "# For build in directory: " << currentcwd << "\n"
       << "# It was generated by CMake: "
       << cmSystemTools::GetCMakeCommand() << std::endl;
  /* clang-format on */

  /* clang-format off */
  fout << "# You can edit this file to change values found and used by cmake."
       << std::endl
       << "# If you do not want to change any of the values, simply exit the "
       "editor." << std::endl
       << "# If you do want to change a value, simply edit, save, and exit "
       "the editor." << std::endl
       << "# The syntax for the file is as follows:\n"
       << "# KEY:TYPE=VALUE\n"
       << "# KEY is the name of a variable in the cache.\n"
       << "# TYPE is a hint to GUIs for the type of VALUE, DO NOT EDIT "
       "TYPE!." << std::endl
       << "# VALUE is the current value for the KEY.\n\n";
  /* clang-format on */

  fout << "########################\n";
  fout << "# EXTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (auto const& i : this->Cache) {
    CacheEntry const& ce = i.second;
    cmStateEnums::CacheEntryType t = ce.Type;
    if (!ce.Initialized) {
      /*
        // This should be added in, but is not for now.
      cmSystemTools::Error("Cache entry \"" + i.first + "\" is uninitialized");
      */
    } else if (t != cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = ce.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, help);
      } else {
        cmCacheManager::OutputHelpString(fout, "Missing description");
      }
      cmCacheManager::OutputKey(fout, i.first);
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      cmCacheManager::OutputValue(fout, ce.Value);
      fout << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.first, ce.Value,
                                                     messenger);
      fout << "\n";
    }
  }

  fout << "\n";
  fout << "########################\n";
  fout << "# INTERNAL cache entries\n";
  fout << "########################\n";
  fout << "\n";

  for (cmCacheManager::CacheIterator i = this->NewIterator(); !i.IsAtEnd();
       i.Next()) {
    if (!i.Initialized()) {
      continue;
    }

    cmStateEnums::CacheEntryType t = i.GetType();
    this->WritePropertyEntries(fout, i, messenger);
    if (t == cmStateEnums::INTERNAL) {
      // Format is key:type=value
      if (const char* help = i.GetProperty("HELPSTRING")) {
        cmCacheManager::OutputHelpString(fout, help);
      }
      cmCacheManager::OutputKey(fout, i.GetName());
      fout << ":" << cmState::CacheEntryTypeToString(t) << "=";
      cmCacheManager::OutputValue(fout, i.GetValue());
      fout << "\n";
      cmCacheManager::OutputNewlineTruncationWarning(fout, i.GetName(),
                                                     i.GetValue(), messenger);
    }
  }
  fout << "\n";
  fout.Close();
  std::string checkCacheFile = path;
  checkCacheFile += "/CMakeFiles";
  cmSystemTools::MakeDirectory(checkCacheFile);
  checkCacheFile += "/cmake.check_cache";
  cmsys::ofstream checkCache(checkCacheFile.c_str());
  if (!checkCache) {
    cmSystemTools::Error("Unable to open check cache file for write. " +
                         checkCacheFile);
    return false;
  }
  checkCache << "# This file is generated by cmake for dependency checking "
                "of the CMakeCache.txt file\n";
  return true;
}